

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O1

BoxArray * __thiscall amrex::AmrMesh::MakeBaseGrids(BoxArray *__return_storage_ptr__,AmrMesh *this)

{
  pointer pGVar1;
  pointer pIVar2;
  pointer pBVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  undefined8 uVar7;
  bool bVar8;
  int idim;
  int iVar9;
  int iVar10;
  uint uVar11;
  pointer pBVar12;
  long lVar13;
  BoxArray *pBVar14;
  int dir_1;
  byte bVar15;
  Box result;
  IntVect fac;
  Box result_1;
  Box local_88;
  IntVect local_60;
  int local_54 [3];
  undefined8 local_48;
  int local_40;
  int local_3c [6];
  int local_24 [3];
  
  bVar15 = 0;
  local_60.vect[0] = 2;
  local_60.vect[1] = 2;
  local_60.vect[2] = 2;
  pGVar1 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = *(long *)(pGVar1->domain).smallend.vect;
  lVar4 = *(long *)((pGVar1->domain).smallend.vect + 2);
  lVar5 = *(long *)(pGVar1->domain).bigend.vect;
  uVar6 = *(ulong *)((pGVar1->domain).bigend.vect + 2);
  local_88.bigend.vect[1] = (int)((ulong)lVar5 >> 0x20);
  local_88.bigend.vect[2] = (int)uVar6;
  local_88.btype.itype = (int)(uVar6 >> 0x20);
  local_88.smallend.vect[2] = (int)lVar4;
  local_88.bigend.vect[0] = (int)((ulong)lVar4 >> 0x20);
  local_24[0] = 2;
  local_24[1] = 2;
  local_24[2] = 2;
  local_88.smallend.vect[0] = (int)lVar13;
  if (local_88.smallend.vect[0] < 0) {
    local_88.smallend.vect[0] = local_88.smallend.vect[0] + 1;
    uVar11 = -local_88.smallend.vect[0];
    if (0 < local_88.smallend.vect[0]) {
      uVar11 = local_88.smallend.vect[0];
    }
    local_88.smallend.vect[0] = ~(uVar11 >> 1);
  }
  else {
    local_88.smallend.vect[0] = (uint)local_88.smallend.vect[0] >> 1;
  }
  local_88.smallend.vect[1] = (int)((ulong)lVar13 >> 0x20);
  if (lVar13 < 0) {
    local_88.smallend.vect[1] = local_88.smallend.vect[1] + 1;
    uVar11 = -local_88.smallend.vect[1];
    if (0 < local_88.smallend.vect[1]) {
      uVar11 = local_88.smallend.vect[1];
    }
    local_88.smallend.vect[1] = ~(uVar11 >> 1);
  }
  else {
    local_88.smallend.vect[1] = (uint)local_88.smallend.vect[1] >> 1;
  }
  if (local_88.smallend.vect[2] < 0) {
    local_88.smallend.vect[2] = local_88.smallend.vect[2] + 1;
    uVar11 = -local_88.smallend.vect[2];
    if (0 < local_88.smallend.vect[2]) {
      uVar11 = local_88.smallend.vect[2];
    }
    local_88.smallend.vect[2] = ~(uVar11 >> 1);
  }
  else {
    local_88.smallend.vect[2] = (uint)local_88.smallend.vect[2] >> 1;
  }
  local_88.btype.itype = (uint)(uVar6 >> 0x20);
  local_88.bigend.vect[2] = (int)uVar6;
  if (local_88.btype.itype == 0) {
    if (lVar4 < 0) {
      local_88.bigend.vect[0] = local_88.bigend.vect[0] + 1;
      uVar11 = -local_88.bigend.vect[0];
      if (0 < local_88.bigend.vect[0]) {
        uVar11 = local_88.bigend.vect[0];
      }
      local_88.bigend.vect[0] = ~(uVar11 >> 1);
    }
    else {
      local_88.bigend.vect[0] = (uint)local_88.bigend.vect[0] >> 1;
    }
    if (lVar5 < 0) {
      local_88.bigend.vect[1] = local_88.bigend.vect[1] + 1;
      uVar11 = -local_88.bigend.vect[1];
      if (0 < local_88.bigend.vect[1]) {
        uVar11 = local_88.bigend.vect[1];
      }
      local_88.bigend.vect[1] = ~(uVar11 >> 1);
    }
    else {
      local_88.bigend.vect[1] = (uint)local_88.bigend.vect[1] >> 1;
    }
    if (local_88.bigend.vect[2] < 0) {
      local_88.bigend.vect[2] = local_88.bigend.vect[2] + 1;
      uVar11 = -local_88.bigend.vect[2];
      if (0 < local_88.bigend.vect[2]) {
        uVar11 = local_88.bigend.vect[2];
      }
      local_88.bigend.vect[2] = ~(uVar11 >> 1);
    }
    else {
      local_88.bigend.vect[2] = (uint)local_88.bigend.vect[2] >> 1;
    }
  }
  else {
    local_54[0] = 0;
    local_54[1] = 0;
    local_54[2] = 0;
    lVar13 = 0;
    do {
      if (((local_88.btype.itype >> ((uint)lVar13 & 0x1f) & 1) != 0) &&
         (local_88.bigend.vect[lVar13] % local_24[lVar13] != 0)) {
        local_54[lVar13] = 1;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if (lVar4 < 0) {
      local_88.bigend.vect[0] = local_88.bigend.vect[0] + 1;
      uVar11 = -local_88.bigend.vect[0];
      if (0 < local_88.bigend.vect[0]) {
        uVar11 = local_88.bigend.vect[0];
      }
      local_88.bigend.vect[0] = ~(uVar11 >> 1);
    }
    else {
      local_88.bigend.vect[0] = (uint)local_88.bigend.vect[0] >> 1;
    }
    if (lVar5 < 0) {
      local_88.bigend.vect[1] = local_88.bigend.vect[1] + 1;
      uVar11 = -local_88.bigend.vect[1];
      if (0 < local_88.bigend.vect[1]) {
        uVar11 = local_88.bigend.vect[1];
      }
      local_88.bigend.vect[1] = ~(uVar11 >> 1);
    }
    else {
      local_88.bigend.vect[1] = (uint)local_88.bigend.vect[1] >> 1;
    }
    if (local_88.bigend.vect[2] < 0) {
      local_88.bigend.vect[2] = local_88.bigend.vect[2] + 1;
      uVar11 = -local_88.bigend.vect[2];
      if (0 < local_88.bigend.vect[2]) {
        uVar11 = local_88.bigend.vect[2];
      }
      local_88.bigend.vect[2] = ~(uVar11 >> 1);
    }
    else {
      local_88.bigend.vect[2] = (uint)local_88.bigend.vect[2] >> 1;
    }
    local_88.bigend.vect[0] = local_88.bigend.vect[0] + local_54[0];
    local_88.bigend.vect[1] = local_88.bigend.vect[1] + local_54[1];
    local_88.bigend.vect[2] = local_88.bigend.vect[2] + local_54[2];
  }
  local_3c[3] = local_88.btype.itype;
  local_48 = CONCAT44(local_88.smallend.vect[1] * 2,local_88.smallend.vect[0] * 2);
  local_40 = local_88.smallend.vect[2] << 1;
  local_3c[0] = local_88.bigend.vect[0] * 2 + (~local_88.btype.itype & 1);
  local_3c[1] = local_88.bigend.vect[1] * 2 + (uint)((uVar6 & 0x200000000) == 0);
  local_3c[2] = local_88.bigend.vect[2] * 2 + (uint)((uVar6 & 0x400000000) == 0);
  lVar13 = 0;
  do {
    if ((pGVar1->domain).bigend.vect[lVar13] - (pGVar1->domain).smallend.vect[lVar13] !=
        local_3c[lVar13] - *(int *)((long)&local_48 + lVar13 * 4)) {
      local_60.vect[lVar13] = 1;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  lVar13 = *(long *)(pGVar1->domain).smallend.vect;
  lVar4 = *(long *)((pGVar1->domain).smallend.vect + 2);
  lVar5 = *(long *)(pGVar1->domain).bigend.vect;
  uVar7 = *(undefined8 *)((pGVar1->domain).bigend.vect + 2);
  local_88.bigend.vect[1] = (int)((ulong)lVar5 >> 0x20);
  local_88.bigend.vect[2] = (int)uVar7;
  local_88.btype.itype = SUB84(uVar7,4);
  local_88.smallend.vect[2] = (int)lVar4;
  local_88.bigend.vect[0] = (int)((ulong)lVar4 >> 0x20);
  if (((local_60.vect[0] == 1) && (local_60.vect[1] == 1)) &&
     (local_88.smallend.vect._0_8_ = lVar13, local_60.vect[2] == 1)) goto LAB_005c53ff;
  local_88.smallend.vect[0] = (int)lVar13;
  if (local_60.vect[0] != 1) {
    if (local_60.vect[0] == 4) {
      if (local_88.smallend.vect[0] < 0) {
        local_88.smallend.vect[0] = local_88.smallend.vect[0] + 1;
        uVar11 = -local_88.smallend.vect[0];
        if (0 < local_88.smallend.vect[0]) {
          uVar11 = local_88.smallend.vect[0];
        }
        uVar11 = uVar11 >> 2;
LAB_005c514f:
        local_88.smallend.vect[0] = ~uVar11;
      }
      else {
        local_88.smallend.vect[0] = (uint)local_88.smallend.vect[0] >> 2;
      }
    }
    else if (local_60.vect[0] == 2) {
      if (local_88.smallend.vect[0] < 0) {
        local_88.smallend.vect[0] = local_88.smallend.vect[0] + 1;
        uVar11 = -local_88.smallend.vect[0];
        if (0 < local_88.smallend.vect[0]) {
          uVar11 = local_88.smallend.vect[0];
        }
        uVar11 = uVar11 >> 1;
        goto LAB_005c514f;
      }
      local_88.smallend.vect[0] = (uint)local_88.smallend.vect[0] >> 1;
    }
    else if (local_88.smallend.vect[0] < 0) {
      iVar10 = local_88.smallend.vect[0] + 1;
      iVar9 = -iVar10;
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      local_88.smallend.vect[0] = ~(iVar9 / local_60.vect[0]);
    }
    else {
      local_88.smallend.vect[0] = local_88.smallend.vect[0] / local_60.vect[0];
    }
  }
  local_88.smallend.vect[1] = (int)((ulong)lVar13 >> 0x20);
  if (local_60.vect[1] != 1) {
    if (local_60.vect[1] == 4) {
      if (lVar13 < 0) {
        local_88.smallend.vect[1] = local_88.smallend.vect[1] + 1;
        uVar11 = -local_88.smallend.vect[1];
        if (0 < local_88.smallend.vect[1]) {
          uVar11 = local_88.smallend.vect[1];
        }
        uVar11 = uVar11 >> 2;
LAB_005c51ae:
        local_88.smallend.vect[1] = ~uVar11;
      }
      else {
        local_88.smallend.vect[1] = (uint)local_88.smallend.vect[1] >> 2;
      }
    }
    else if (local_60.vect[1] == 2) {
      if (lVar13 < 0) {
        local_88.smallend.vect[1] = local_88.smallend.vect[1] + 1;
        uVar11 = -local_88.smallend.vect[1];
        if (0 < local_88.smallend.vect[1]) {
          uVar11 = local_88.smallend.vect[1];
        }
        uVar11 = uVar11 >> 1;
        goto LAB_005c51ae;
      }
      local_88.smallend.vect[1] = (uint)local_88.smallend.vect[1] >> 1;
    }
    else if (lVar13 < 0) {
      iVar10 = local_88.smallend.vect[1] + 1;
      iVar9 = -iVar10;
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      local_88.smallend.vect[1] = ~(iVar9 / local_60.vect[1]);
    }
    else {
      local_88.smallend.vect[1] = local_88.smallend.vect[1] / local_60.vect[1];
    }
  }
  if (local_60.vect[2] != 1) {
    if (local_60.vect[2] == 4) {
      if (local_88.smallend.vect[2] < 0) {
        local_88.smallend.vect[2] = local_88.smallend.vect[2] + 1;
        uVar11 = -local_88.smallend.vect[2];
        if (0 < local_88.smallend.vect[2]) {
          uVar11 = local_88.smallend.vect[2];
        }
        uVar11 = uVar11 >> 2;
LAB_005c5217:
        local_88.smallend.vect[2] = ~uVar11;
      }
      else {
        local_88.smallend.vect[2] = (uint)local_88.smallend.vect[2] >> 2;
      }
    }
    else if (local_60.vect[2] == 2) {
      if (local_88.smallend.vect[2] < 0) {
        local_88.smallend.vect[2] = local_88.smallend.vect[2] + 1;
        uVar11 = -local_88.smallend.vect[2];
        if (0 < local_88.smallend.vect[2]) {
          uVar11 = local_88.smallend.vect[2];
        }
        uVar11 = uVar11 >> 1;
        goto LAB_005c5217;
      }
      local_88.smallend.vect[2] = (uint)local_88.smallend.vect[2] >> 1;
    }
    else if (local_88.smallend.vect[2] < 0) {
      iVar10 = local_88.smallend.vect[2] + 1;
      iVar9 = -iVar10;
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      local_88.smallend.vect[2] = ~(iVar9 / local_60.vect[2]);
    }
    else {
      local_88.smallend.vect[2] = local_88.smallend.vect[2] / local_60.vect[2];
    }
  }
  local_88.btype.itype = SUB84(uVar7,4);
  local_88.bigend.vect[2] = (int)uVar7;
  if (local_88.btype.itype == 0) {
    if (local_60.vect[0] != 1) {
      if (local_60.vect[0] == 4) {
        if (lVar4 < 0) {
          local_88.bigend.vect[0] = local_88.bigend.vect[0] + 1;
          uVar11 = -local_88.bigend.vect[0];
          if (0 < local_88.bigend.vect[0]) {
            uVar11 = local_88.bigend.vect[0];
          }
          uVar11 = uVar11 >> 2;
LAB_005c54ff:
          local_88.bigend.vect[0] = ~uVar11;
        }
        else {
          local_88.bigend.vect[0] = (uint)local_88.bigend.vect[0] >> 2;
        }
      }
      else if (local_60.vect[0] == 2) {
        if (lVar4 < 0) {
          local_88.bigend.vect[0] = local_88.bigend.vect[0] + 1;
          uVar11 = -local_88.bigend.vect[0];
          if (0 < local_88.bigend.vect[0]) {
            uVar11 = local_88.bigend.vect[0];
          }
          uVar11 = uVar11 >> 1;
          goto LAB_005c54ff;
        }
        local_88.bigend.vect[0] = (uint)local_88.bigend.vect[0] >> 1;
      }
      else if (lVar4 < 0) {
        iVar10 = local_88.bigend.vect[0] + 1;
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        local_88.bigend.vect[0] = ~(iVar9 / local_60.vect[0]);
      }
      else {
        local_88.bigend.vect[0] = local_88.bigend.vect[0] / local_60.vect[0];
      }
    }
    if (local_60.vect[1] != 1) {
      if (local_60.vect[1] == 4) {
        if (lVar5 < 0) {
          local_88.bigend.vect[1] = local_88.bigend.vect[1] + 1;
          uVar11 = -local_88.bigend.vect[1];
          if (0 < local_88.bigend.vect[1]) {
            uVar11 = local_88.bigend.vect[1];
          }
          uVar11 = uVar11 >> 2;
LAB_005c555f:
          local_88.bigend.vect[1] = ~uVar11;
        }
        else {
          local_88.bigend.vect[1] = (uint)local_88.bigend.vect[1] >> 2;
        }
      }
      else if (local_60.vect[1] == 2) {
        if (lVar5 < 0) {
          local_88.bigend.vect[1] = local_88.bigend.vect[1] + 1;
          uVar11 = -local_88.bigend.vect[1];
          if (0 < local_88.bigend.vect[1]) {
            uVar11 = local_88.bigend.vect[1];
          }
          uVar11 = uVar11 >> 1;
          goto LAB_005c555f;
        }
        local_88.bigend.vect[1] = (uint)local_88.bigend.vect[1] >> 1;
      }
      else if (lVar5 < 0) {
        iVar10 = local_88.bigend.vect[1] + 1;
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        local_88.bigend.vect[1] = ~(iVar9 / local_60.vect[1]);
      }
      else {
        local_88.bigend.vect[1] = local_88.bigend.vect[1] / local_60.vect[1];
      }
    }
    if (local_60.vect[2] != 1) {
      if (local_60.vect[2] == 4) {
        if (local_88.bigend.vect[2] < 0) {
          local_88.bigend.vect[2] = local_88.bigend.vect[2] + 1;
          uVar11 = -local_88.bigend.vect[2];
          if (0 < local_88.bigend.vect[2]) {
            uVar11 = local_88.bigend.vect[2];
          }
          uVar11 = uVar11 >> 2;
LAB_005c55d0:
          local_88.bigend.vect[2] = ~uVar11;
        }
        else {
          local_88.bigend.vect[2] = (uint)local_88.bigend.vect[2] >> 2;
        }
      }
      else if (local_60.vect[2] == 2) {
        if (local_88.bigend.vect[2] < 0) {
          local_88.bigend.vect[2] = local_88.bigend.vect[2] + 1;
          uVar11 = -local_88.bigend.vect[2];
          if (0 < local_88.bigend.vect[2]) {
            uVar11 = local_88.bigend.vect[2];
          }
          uVar11 = uVar11 >> 1;
          goto LAB_005c55d0;
        }
        local_88.bigend.vect[2] = (uint)local_88.bigend.vect[2] >> 1;
      }
      else if (local_88.bigend.vect[2] < 0) {
        iVar10 = local_88.bigend.vect[2] + 1;
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        local_88.bigend.vect[2] = ~(iVar9 / local_60.vect[2]);
      }
      else {
        local_88.bigend.vect[2] = local_88.bigend.vect[2] / local_60.vect[2];
      }
    }
  }
  else {
    local_54[0] = 0;
    local_54[1] = 0;
    local_54[2] = 0;
    lVar13 = 0;
    do {
      if (((local_88.btype.itype >> ((uint)lVar13 & 0x1f) & 1) != 0) &&
         (local_88.bigend.vect[lVar13] % local_60.vect[lVar13] != 0)) {
        local_54[lVar13] = 1;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if (local_60.vect[0] != 1) {
      if (local_60.vect[0] == 4) {
        if (lVar4 < 0) {
          local_88.bigend.vect[0] = local_88.bigend.vect[0] + 1;
          uVar11 = -local_88.bigend.vect[0];
          if (0 < local_88.bigend.vect[0]) {
            uVar11 = local_88.bigend.vect[0];
          }
          uVar11 = uVar11 >> 2;
LAB_005c530a:
          local_88.bigend.vect[0] = ~uVar11;
        }
        else {
          local_88.bigend.vect[0] = (uint)local_88.bigend.vect[0] >> 2;
        }
      }
      else if (local_60.vect[0] == 2) {
        if (lVar4 < 0) {
          local_88.bigend.vect[0] = local_88.bigend.vect[0] + 1;
          uVar11 = -local_88.bigend.vect[0];
          if (0 < local_88.bigend.vect[0]) {
            uVar11 = local_88.bigend.vect[0];
          }
          uVar11 = uVar11 >> 1;
          goto LAB_005c530a;
        }
        local_88.bigend.vect[0] = (uint)local_88.bigend.vect[0] >> 1;
      }
      else if (lVar4 < 0) {
        iVar10 = local_88.bigend.vect[0] + 1;
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        local_88.bigend.vect[0] = ~(iVar9 / local_60.vect[0]);
      }
      else {
        local_88.bigend.vect[0] = local_88.bigend.vect[0] / local_60.vect[0];
      }
    }
    if (local_60.vect[1] != 1) {
      if (local_60.vect[1] == 4) {
        if (lVar5 < 0) {
          local_88.bigend.vect[1] = local_88.bigend.vect[1] + 1;
          uVar11 = -local_88.bigend.vect[1];
          if (0 < local_88.bigend.vect[1]) {
            uVar11 = local_88.bigend.vect[1];
          }
          uVar11 = uVar11 >> 2;
LAB_005c536c:
          local_88.bigend.vect[1] = ~uVar11;
        }
        else {
          local_88.bigend.vect[1] = (uint)local_88.bigend.vect[1] >> 2;
        }
      }
      else if (local_60.vect[1] == 2) {
        if (lVar5 < 0) {
          local_88.bigend.vect[1] = local_88.bigend.vect[1] + 1;
          uVar11 = -local_88.bigend.vect[1];
          if (0 < local_88.bigend.vect[1]) {
            uVar11 = local_88.bigend.vect[1];
          }
          uVar11 = uVar11 >> 1;
          goto LAB_005c536c;
        }
        local_88.bigend.vect[1] = (uint)local_88.bigend.vect[1] >> 1;
      }
      else if (lVar5 < 0) {
        iVar10 = local_88.bigend.vect[1] + 1;
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        local_88.bigend.vect[1] = ~(iVar9 / local_60.vect[1]);
      }
      else {
        local_88.bigend.vect[1] = local_88.bigend.vect[1] / local_60.vect[1];
      }
    }
    if (local_60.vect[2] != 1) {
      if (local_60.vect[2] == 4) {
        if (local_88.bigend.vect[2] < 0) {
          local_88.bigend.vect[2] = local_88.bigend.vect[2] + 1;
          uVar11 = -local_88.bigend.vect[2];
          if (0 < local_88.bigend.vect[2]) {
            uVar11 = local_88.bigend.vect[2];
          }
          uVar11 = uVar11 >> 2;
LAB_005c53d0:
          local_88.bigend.vect[2] = ~uVar11;
        }
        else {
          local_88.bigend.vect[2] = (uint)local_88.bigend.vect[2] >> 2;
        }
      }
      else if (local_60.vect[2] == 2) {
        if (local_88.bigend.vect[2] < 0) {
          local_88.bigend.vect[2] = local_88.bigend.vect[2] + 1;
          uVar11 = -local_88.bigend.vect[2];
          if (0 < local_88.bigend.vect[2]) {
            uVar11 = local_88.bigend.vect[2];
          }
          uVar11 = uVar11 >> 1;
          goto LAB_005c53d0;
        }
        local_88.bigend.vect[2] = (uint)local_88.bigend.vect[2] >> 1;
      }
      else if (local_88.bigend.vect[2] < 0) {
        iVar10 = local_88.bigend.vect[2] + 1;
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        local_88.bigend.vect[2] = ~(iVar9 / local_60.vect[2]);
      }
      else {
        local_88.bigend.vect[2] = local_88.bigend.vect[2] / local_60.vect[2];
      }
    }
    local_88.bigend.vect[0] = local_88.bigend.vect[0] + local_54[0];
    local_88.bigend.vect[1] = local_88.bigend.vect[1] + local_54[1];
    local_88.bigend.vect[2] = local_88.bigend.vect[2] + local_54[2];
  }
LAB_005c53ff:
  BoxArray::BoxArray(__return_storage_ptr__,&local_88);
  pIVar2 = (this->super_AmrInfo).max_grid_size.
           super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_88.smallend.vect[2] = pIVar2->vect[2] / local_60.vect[2];
  local_88.smallend.vect._0_8_ =
       (long)pIVar2->vect[1] / (long)local_60.vect[1] << 0x20 |
       (long)pIVar2->vect[0] / (long)local_60.vect[0] & 0xffffffffU;
  BoxArray::maxSize(__return_storage_ptr__,&local_88.smallend);
  BoxArray::refine(__return_storage_ptr__,&local_60);
  if ((this->super_AmrInfo).refine_grid_layout == true) {
    ChopGrids(this,0,__return_storage_ptr__,*(int *)(ParallelContext::frames + 0x10));
  }
  bVar8 = BoxArray::operator==
                    (__return_storage_ptr__,
                     (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (bVar8) {
    pBVar3 = (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar12 = pBVar3;
    pBVar14 = __return_storage_ptr__;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      *(undefined8 *)&pBVar14->m_bat = *(undefined8 *)&pBVar12->m_bat;
      pBVar12 = (pointer)((long)pBVar12 + ((ulong)bVar15 * -2 + 1) * 8);
      pBVar14 = (BoxArray *)((long)pBVar14 + (ulong)bVar15 * -0x10 + 8);
    }
    (__return_storage_ptr__->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (pBVar3->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->m_ref).
                super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pBVar3->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    (__return_storage_ptr__->m_simplified_list).
    super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pBVar3->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__return_storage_ptr__->m_simplified_list).
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pBVar3->m_simplified_list).
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  (*this->_vptr_AmrMesh[5])(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

BoxArray
AmrMesh::MakeBaseGrids () const
{
    IntVect fac(2);
    const Box& dom = geom[0].Domain();
    const Box dom2 = amrex::refine(amrex::coarsen(dom,2),2);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (dom.length(idim) != dom2.length(idim)) {
            fac[idim] = 1;
        }
    }
    BoxArray ba(amrex::coarsen(dom,fac));
    ba.maxSize(max_grid_size[0]/fac);
    ba.refine(fac);
    // Boxes in ba have even number of cells in each direction
    // unless the domain has odd number of cells in that direction.
    if (refine_grid_layout) {
        ChopGrids(0, ba, ParallelDescriptor::NProcs());
    }
    if (ba == grids[0]) {
        ba = grids[0];  // to avoid duplicates
    }
    PostProcessBaseGrids(ba);
    return ba;
}